

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O3

void __thiscall diligent_spirv_cross::ParsedIR::reset_all_of_type(ParsedIR *this,Types type)

{
  uint uVar1;
  size_t sVar2;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  long lVar5;
  
  sVar2 = this->ids_for_type[type].
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
          buffer_size;
  if (sVar2 != 0) {
    pTVar3 = this->ids_for_type[type].
             super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr;
    lVar5 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar5);
      pVVar4 = (this->ids).super_VectorView<diligent_spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == type) {
        pVVar4 = pVVar4 + uVar1;
        if (pVVar4->holder != (IVariant *)0x0) {
          (**(code **)(*(long *)pVVar4->group->pools[type]._M_t.
                                super___uniq_ptr_impl<diligent_spirv_cross::ObjectPoolBase,_std::default_delete<diligent_spirv_cross::ObjectPoolBase>_>
                                ._M_t + 0x10))();
        }
        pVVar4->holder = (IVariant *)0x0;
        pVVar4->type = TypeNone;
      }
      lVar5 = lVar5 + 4;
    } while (sVar2 << 2 != lVar5);
  }
  this->ids_for_type[type].
  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.buffer_size = 0;
  return;
}

Assistant:

void ParsedIR::reset_all_of_type(Types type)
{
	for (auto &id : ids_for_type[type])
		if (ids[id].get_type() == type)
			ids[id].reset();

	ids_for_type[type].clear();
}